

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)

{
  ZSTD_bounds ZVar1;
  ZSTD_dParameter dParam_local;
  ZSTD_bounds bounds;
  
  bounds.error = 0;
  bounds.lowerBound = 0;
  bounds.upperBound = 0;
  if (dParam == ZSTD_d_windowLogMax) {
    bounds.lowerBound = 10;
    bounds.upperBound = 0x1f;
  }
  else if (dParam == ZSTD_d_experimentalParam1) {
    bounds.lowerBound = 0;
    bounds.upperBound = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam2) {
    bounds.lowerBound = 0;
    bounds.upperBound = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam3) {
    bounds.lowerBound = 0;
    bounds.upperBound = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam4) {
    bounds.lowerBound = 0;
    bounds.upperBound = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam5) {
    bounds.lowerBound = 0;
    bounds.upperBound = 1;
  }
  else {
    bounds.error = 0xffffffffffffffd8;
  }
  ZVar1.lowerBound = bounds.lowerBound;
  ZVar1.error = bounds.error;
  ZVar1.upperBound = bounds.upperBound;
  return ZVar1;
}

Assistant:

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)
{
    ZSTD_bounds bounds = { 0, 0, 0 };
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            bounds.lowerBound = ZSTD_WINDOWLOG_ABSOLUTEMIN;
            bounds.upperBound = ZSTD_WINDOWLOG_MAX;
            return bounds;
        case ZSTD_d_format:
            bounds.lowerBound = (int)ZSTD_f_zstd1;
            bounds.upperBound = (int)ZSTD_f_zstd1_magicless;
            ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
            return bounds;
        case ZSTD_d_stableOutBuffer:
            bounds.lowerBound = (int)ZSTD_bm_buffered;
            bounds.upperBound = (int)ZSTD_bm_stable;
            return bounds;
        case ZSTD_d_forceIgnoreChecksum:
            bounds.lowerBound = (int)ZSTD_d_validateChecksum;
            bounds.upperBound = (int)ZSTD_d_ignoreChecksum;
            return bounds;
        case ZSTD_d_refMultipleDDicts:
            bounds.lowerBound = (int)ZSTD_rmd_refSingleDDict;
            bounds.upperBound = (int)ZSTD_rmd_refMultipleDDicts;
            return bounds;
        case ZSTD_d_disableHuffmanAssembly:
            bounds.lowerBound = 0;
            bounds.upperBound = 1;
            return bounds;

        default:;
    }
    bounds.error = ERROR(parameter_unsupported);
    return bounds;
}